

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

Entity * __thiscall Entity::getPlayerCollision(Entity *this)

{
  list<Entity_*,_std::allocator<Entity_*>_> *e_00;
  Entity *this_00;
  list<Entity_*,_std::allocator<Entity_*>_> *in_RDI;
  Entity *ret;
  Player *player;
  ResourceManager *rm;
  list<Entity_*,_std::allocator<Entity_*>_> e;
  undefined8 in_stack_ffffffffffffff88;
  int index;
  ResourceManager *in_stack_ffffffffffffff90;
  Entity *in_stack_ffffffffffffffc8;
  
  index = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::list
            ((list<Entity_*,_std::allocator<Entity_*>_> *)0x10f78d);
  ResourceManager::getInstance();
  e_00 = (list<Entity_*,_std::allocator<Entity_*>_> *)
         ResourceManager::getData(in_stack_ffffffffffffff90,index);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back(in_RDI,(value_type *)e_00);
  this_00 = checkCollisions(in_stack_ffffffffffffffc8,e_00);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::clear
            ((list<Entity_*,_std::allocator<Entity_*>_> *)this_00);
  std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::~list
            ((list<Entity_*,_std::allocator<Entity_*>_> *)0x10f81b);
  return this_00;
}

Assistant:

Entity *Entity::getPlayerCollision(void)
{
   std::list<Entity *> e;

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   e.push_back(player);

   Entity *ret = checkCollisions(e);
   e.clear();
   return ret;
}